

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

void __thiscall notch::io::PlainTextNetworkWriter::save(PlainTextNetworkWriter *this,Net *net)

{
  pointer pLVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  NetSpec netSpec;
  NetSpec local_80;
  
  NetSpec::NetSpec(&local_80,net);
  pLVar1 = local_80.layers.
           super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"net: ",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_80.tag._M_dataplus._M_p,local_80.tag._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"format: 1.0\n",0xc);
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"inputs: ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"outputs: ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  poVar2 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"layers: ",8);
  lVar5 = ((long)local_80.layers.
                 super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 5) *
          -0x5555555555555555;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(this->out,"%%\n",3);
  if (local_80.layers.
      super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>._M_impl.
      super__Vector_impl_data._M_finish != pLVar1) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      save(this,(LayerSpec *)
                ((long)&((local_80.layers.
                          super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start)->tag)._M_dataplus._M_p + lVar4)
          );
      if (uVar3 < lVar5 - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(this->out,"%%\n",3);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x60;
    } while (lVar5 + (ulong)(lVar5 == 0) != uVar3);
  }
  core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::~vector
            (&local_80.layers);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tag._M_dataplus._M_p != &local_80.tag.field_2) {
    operator_delete(local_80.tag._M_dataplus._M_p);
  }
  return;
}

Assistant:

void save(const Net &net) {
        auto netSpec = NetSpec(net);
        size_t n = netSpec.layers.size();
        out << "net: " << netSpec.tag << "\n";
        out << "format: 1.0\n"; // format version
        out << "inputs: " << netSpec.inputDim << "\n";
        out << "outputs: " << netSpec.outputDim << "\n";
        out << "layers: " << n << "\n";
        out << "%%\n";
        for (size_t i = 0; i < n; ++i) {
            save(netSpec.layers[i]);
            if (i < (n - 1)) {
                out << "%%\n";
            }
        }
    }